

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O3

DenomInfo * __thiscall
duckdb::CardinalityEstimator::GetDenominator
          (DenomInfo *__return_storage_ptr__,CardinalityEstimator *this,JoinRelationSet *set)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  Subgraph2Denominator left;
  Subgraph2Denominator left_00;
  Subgraph2Denominator right;
  Subgraph2Denominator right_00;
  Subgraph2Denominator right_01;
  Subgraph2Denominator right_02;
  pointer pSVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  DenomInfo *pDVar9;
  int iVar10;
  JoinRelationSet *pJVar11;
  long lVar12;
  Subgraph2Denominator *pSVar13;
  ulong uVar14;
  Subgraph2Denominator *pSVar15;
  CardinalityEstimator *pCVar16;
  long lVar17;
  CardinalityEstimator *edge;
  _Prime_rehash_policy *this_00;
  size_t *this_01;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  vector<duckdb::Subgraph2Denominator,_true> subgraphs;
  Subgraph2Denominator right_subgraph;
  vector<unsigned_long,_true> subgraph_connections;
  vector<duckdb::FilterInfoWithTotalDomains,_true> edges;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unused_edge_tdoms;
  vector<duckdb::Subgraph2Denominator,_true> local_138;
  string local_118;
  undefined1 local_f8 [40];
  JoinRelationSet *local_d0;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  DenomInfo *local_b8;
  size_t local_b0;
  size_t sStack_a8;
  undefined8 local_a0;
  size_t local_98;
  size_t sStack_90;
  undefined8 local_88;
  vector<duckdb::FilterInfoWithTotalDomains,_true> local_80;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_138.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_start = (Subgraph2Denominator *)0x0;
  local_138.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Subgraph2Denominator *)0x0;
  local_138.
  super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Subgraph2Denominator *)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_d0 = set;
  GetEdges(&local_80,&this->relations_to_tdoms,set);
  local_b8 = __return_storage_ptr__;
  if (local_80.
      super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      .
      super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_80.
      super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      .
      super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar13 = (Subgraph2Denominator *)0x0;
    pSVar15 = (Subgraph2Denominator *)0x0;
    pCVar16 = (CardinalityEstimator *)CONCAT44(local_c8._4_4_,(undefined4)local_c8);
  }
  else {
    local_c8 = (CardinalityEstimator *)&this->set_manager;
    edge = (CardinalityEstimator *)
           local_80.
           super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
           .
           super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar6 = local_138.
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               .
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x18) {
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  (&(local_138.
                     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     .
                     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ._M_impl.super__Vector_impl_data._M_start)->relations);
        JoinRelationSet::ToString_abi_cxx11_((string *)local_f8,(pSVar6->relations).ptr);
        JoinRelationSet::ToString_abi_cxx11_(&local_118,local_d0);
        _Var7._M_p = local_118._M_dataplus._M_p;
        if (local_f8._8_8_ == local_118._M_string_length) {
          if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)local_f8._8_8_ ==
              (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)0x0) {
            bVar18 = true;
          }
          else {
            iVar10 = bcmp((void *)local_f8._0_8_,local_118._M_dataplus._M_p,local_f8._8_8_);
            bVar18 = iVar10 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var7._M_p != &local_118.field_2) {
          operator_delete(_Var7._M_p);
        }
        if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_f8._0_8_ !=
            (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_);
        }
        if (!bVar18) goto LAB_0173e3e6;
        if (*(char *)&(edge->relation_set_2_cardinality)._M_h._M_buckets == '\x01') {
          local_f8._0_8_ = &local_68;
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_f8._0_8_,
                     &(edge->relations_to_tdoms).
                      super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                      .
                      super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_f8);
        }
      }
      else {
LAB_0173e3e6:
        SubgraphsConnectedByEdge
                  ((vector<unsigned_long,_true> *)local_f8,(FilterInfoWithTotalDomains *)edge,
                   &local_138);
        pSVar6 = local_138.
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 .
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_f8._0_8_ == local_f8._8_8_) {
          local_118._M_dataplus._M_p = (pointer)0x0;
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity = 0x3ff0000000000000;
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          local_118._M_dataplus._M_p =
               *(pointer *)
                ((long)&((edge->relations_to_tdoms).
                         super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         .
                         super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20);
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          local_118._M_string_length =
               *(size_type *)
                ((long)&((edge->relations_to_tdoms).
                         super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         .
                         super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20);
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          sVar2 = *(size_t *)
                   ((long)&((edge->relations_to_tdoms).
                            super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            .
                            super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28)
          ;
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          sVar3 = *(size_t *)
                   ((long)&((edge->relations_to_tdoms).
                            super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            .
                            super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                            ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28)
          ;
          local_88 = 0x3ff0000000000000;
          left.numerator_relations.ptr = (JoinRelationSet *)local_118._M_string_length;
          left.relations.ptr = (JoinRelationSet *)local_118._M_dataplus._M_p;
          left.denom = (double)local_118.field_2._M_allocated_capacity;
          right_01.numerator_relations.ptr = (JoinRelationSet *)sVar3;
          right_01.relations.ptr = (JoinRelationSet *)sVar2;
          right_01.denom = 1.0;
          local_98 = sVar2;
          sStack_90 = sVar3;
          local_118._M_string_length =
               (size_type)
               UpdateNumeratorRelations(this,left,right_01,(FilterInfoWithTotalDomains *)edge);
          pCVar16 = edge;
          optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                    ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
          local_118._M_dataplus._M_p =
               *(pointer *)
                ((long)&((edge->relations_to_tdoms).
                         super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         .
                         super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                         ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 8);
          local_a0 = 0x3ff0000000000000;
          left_00.numerator_relations.ptr = (JoinRelationSet *)local_118._M_string_length;
          left_00.relations.ptr = (JoinRelationSet *)local_118._M_dataplus._M_p;
          left_00.denom = (double)local_118.field_2._M_allocated_capacity;
          right_02.numerator_relations.ptr = (JoinRelationSet *)sVar3;
          right_02.relations.ptr = (JoinRelationSet *)sVar2;
          right_02.denom = 1.0;
          local_b0 = sVar2;
          sStack_a8 = sVar3;
          local_118.field_2._M_allocated_capacity =
               (size_type)
               CalculateUpdatedDenom(pCVar16,left_00,right_02,(FilterInfoWithTotalDomains *)edge);
          if (local_138.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_138.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::Subgraph2Denominator,std::allocator<duckdb::Subgraph2Denominator>>
            ::_M_realloc_insert<duckdb::Subgraph2Denominator_const&>
                      ((vector<duckdb::Subgraph2Denominator,std::allocator<duckdb::Subgraph2Denominator>>
                        *)&local_138,
                       (iterator)
                       local_138.
                       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       .
                       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Subgraph2Denominator *)&local_118
                      );
          }
          else {
            (local_138.
             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             .
             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ._M_impl.super__Vector_impl_data._M_finish)->denom =
                 (double)local_118.field_2._M_allocated_capacity;
            ((local_138.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish)->relations).ptr =
                 (JoinRelationSet *)local_118._M_dataplus._M_p;
            ((local_138.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish)->numerator_relations).ptr =
                 (JoinRelationSet *)local_118._M_string_length;
            local_138.
            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
            .
            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_138.
                 super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 .
                 super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          lVar12 = (long)(local_f8._8_8_ - local_f8._0_8_) >> 3;
          if (lVar12 == 2) {
            uVar1 = *(ulong *)local_f8._0_8_;
            uVar14 = ((long)local_138.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_138.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            if (uVar14 < uVar1 || uVar14 - uVar1 == 0) {
              ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            uVar4 = *(ulong *)(local_f8._0_8_ + 8);
            if (uVar14 < uVar4 || uVar14 - uVar4 == 0) {
              ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar4);
            }
            pSVar13 = local_138.
                      super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      .
                      super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar1;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->relations);
            pSVar15 = pSVar6 + uVar4;
            pJVar11 = (pSVar13->relations).ptr;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar15->relations);
            pJVar11 = JoinRelationSetManager::Union
                                ((JoinRelationSetManager *)local_c8,pJVar11,(pSVar15->relations).ptr
                                );
            (pSVar13->relations).ptr = pJVar11;
            pCVar16 = this;
            pJVar11 = UpdateNumeratorRelations
                                (this,*pSVar13,*pSVar15,(FilterInfoWithTotalDomains *)edge);
            (pSVar13->numerator_relations).ptr = pJVar11;
            dVar5 = CalculateUpdatedDenom
                              (pCVar16,*pSVar13,*pSVar15,(FilterInfoWithTotalDomains *)edge);
            pSVar13->denom = dVar5;
            (pSVar15->relations).ptr = (JoinRelationSet *)0x0;
            lVar17 = (long)local_138.
                           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           .
                           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_138.
                           super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           .
                           super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar12 = (lVar17 >> 3) * -0x5555555555555555 >> 2;
            pSVar13 = local_138.
                      super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      .
                      super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar12) {
              lVar17 = lVar12 + 1;
              pSVar13 = local_138.
                        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        .
                        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2;
              do {
                if (pSVar13[-2].relations.ptr == (JoinRelationSet *)0x0) {
                  pSVar13 = pSVar13 + -2;
                  goto LAB_0173e927;
                }
                if (pSVar13[-1].relations.ptr == (JoinRelationSet *)0x0) {
                  pSVar13 = pSVar13 + -1;
                  goto LAB_0173e927;
                }
                if ((pSVar13->relations).ptr == (JoinRelationSet *)0x0) goto LAB_0173e927;
                if (pSVar13[1].relations.ptr == (JoinRelationSet *)0x0) {
                  pSVar13 = pSVar13 + 1;
                  goto LAB_0173e927;
                }
                lVar17 = lVar17 + -1;
                pSVar13 = pSVar13 + 4;
              } while (1 < lVar17);
              lVar17 = (long)local_138.
                             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                             .
                             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_138.
                              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                              .
                              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar12 * 4);
              pSVar13 = local_138.
                        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        .
                        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar12 * 4;
            }
            lVar12 = (lVar17 >> 3) * -0x5555555555555555;
            if (lVar12 == 1) {
LAB_0173e90a:
              if ((pSVar13->relations).ptr != (JoinRelationSet *)0x0) {
                pSVar13 = local_138.
                          super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                          .
                          super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            else if (lVar12 == 2) {
LAB_0173e900:
              if ((pSVar13->relations).ptr != (JoinRelationSet *)0x0) {
                pSVar13 = pSVar13 + 1;
                goto LAB_0173e90a;
              }
            }
            else {
              if (lVar12 != 3) goto LAB_0173e970;
              if ((pSVar13->relations).ptr != (JoinRelationSet *)0x0) {
                pSVar13 = pSVar13 + 1;
                goto LAB_0173e900;
              }
            }
LAB_0173e927:
            pSVar15 = pSVar13 + 1;
            if (pSVar15 !=
                local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish &&
                pSVar13 !=
                local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                if ((pSVar15->relations).ptr != (JoinRelationSet *)0x0) {
                  pSVar13->denom = pSVar15->denom;
                  pJVar11 = (pSVar15->numerator_relations).ptr;
                  (pSVar13->relations).ptr = (pSVar15->relations).ptr;
                  (pSVar13->numerator_relations).ptr = pJVar11;
                  pSVar13 = pSVar13 + 1;
                }
                pSVar15 = pSVar15 + 1;
              } while (pSVar15 !=
                       local_138.
                       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       .
                       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (pSVar13 !=
                local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_138.
              super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              .
              super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar13;
            }
          }
          else if (lVar12 == 1) {
            uVar1 = *(ulong *)local_f8._0_8_;
            uVar14 = ((long)local_138.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_138.
                            super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            .
                            super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            if (uVar14 < uVar1 || uVar14 - uVar1 == 0) {
              ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar1);
            }
            local_118._M_dataplus._M_p = (pointer)0x0;
            local_118._M_string_length = 0;
            local_118.field_2._M_allocated_capacity = 0x3ff0000000000000;
            optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                      ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            local_118._M_dataplus._M_p =
                 *(pointer *)
                  ((long)&((edge->relations_to_tdoms).
                           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           .
                           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28);
            optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                      ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            pSVar13 = pSVar6 + uVar1;
            local_118._M_string_length =
                 *(size_t *)
                  ((long)&((edge->relations_to_tdoms).
                           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           .
                           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                           ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x28);
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->relations);
            pJVar11 = (pSVar13->relations).ptr;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                      ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_118);
            bVar18 = JoinRelationSet::IsSubset
                               (pJVar11,(JoinRelationSet *)local_118._M_dataplus._M_p);
            if (bVar18) {
              optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                        ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
              local_118._M_dataplus._M_p =
                   *(pointer *)
                    ((long)&((edge->relations_to_tdoms).
                             super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             .
                             super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20
                    );
              optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                        ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
              local_118._M_string_length =
                   *(size_type *)
                    ((long)&((edge->relations_to_tdoms).
                             super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             .
                             super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                             ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations + 0x20
                    );
            }
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->relations);
            pJVar11 = (pSVar13->relations).ptr;
            optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                      ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
            this_00 = (_Prime_rehash_policy *)
                      ((long)&((edge->relations_to_tdoms).
                               super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                               .
                               super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                               ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations +
                      0x20);
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                      ((optional_ptr<duckdb::JoinRelationSet,_true> *)this_00);
            bVar18 = JoinRelationSet::IsSubset
                               (pJVar11,*(JoinRelationSet **)&this_00->_M_max_load_factor);
            if (bVar18) {
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->relations);
              pJVar11 = (pSVar13->relations).ptr;
              optional_ptr<duckdb::FilterInfo,_true>::CheckValid
                        ((optional_ptr<duckdb::FilterInfo,_true> *)edge);
              this_01 = (size_t *)
                        ((long)&((edge->relations_to_tdoms).
                                 super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                                 .
                                 super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->equivalent_relations +
                        0x28);
              optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                        ((optional_ptr<duckdb::JoinRelationSet,_true> *)this_01);
              bVar18 = JoinRelationSet::IsSubset(pJVar11,(JoinRelationSet *)*this_01);
              if (bVar18) goto LAB_0173e970;
            }
            right.numerator_relations.ptr = (JoinRelationSet *)local_118._M_string_length;
            right.relations.ptr = (JoinRelationSet *)local_118._M_dataplus._M_p;
            right.denom = (double)local_118.field_2._M_allocated_capacity;
            pJVar11 = UpdateNumeratorRelations
                                (this,*pSVar13,right,(FilterInfoWithTotalDomains *)edge);
            (pSVar13->numerator_relations).ptr = pJVar11;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->relations);
            pJVar11 = (pSVar13->relations).ptr;
            optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                      ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_118);
            pCVar16 = local_c8;
            pJVar11 = JoinRelationSetManager::Union
                                ((JoinRelationSetManager *)local_c8,pJVar11,
                                 (JoinRelationSet *)local_118._M_dataplus._M_p);
            (pSVar13->relations).ptr = pJVar11;
            right_00.numerator_relations.ptr = (JoinRelationSet *)local_118._M_string_length;
            right_00.relations.ptr = (JoinRelationSet *)local_118._M_dataplus._M_p;
            right_00.denom = (double)local_118.field_2._M_allocated_capacity;
            dVar5 = CalculateUpdatedDenom
                              (pCVar16,*pSVar13,right_00,(FilterInfoWithTotalDomains *)edge);
            pSVar13->denom = dVar5;
          }
        }
LAB_0173e970:
        if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_f8._0_8_ !=
            (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)0x0) {
          operator_delete((void *)local_f8._0_8_);
        }
      }
      edge = (CardinalityEstimator *)&(edge->relation_set_2_cardinality)._M_h._M_bucket_count;
      pSVar13 = local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pSVar15 = local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar16 = local_c8;
    } while (edge != (CardinalityEstimator *)
                     local_80.
                     super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                     .
                     super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_c8._0_4_ = (undefined4)local_68._M_element_count;
  local_c8._4_4_ = (undefined4)(local_68._M_element_count >> 0x20);
  uVar19 = 0;
  uVar20 = 0;
  if (1 < (ulong)(((long)pSVar13 - (long)pSVar15 >> 3) * -0x5555555555555555)) {
    local_f8._16_8_ = pSVar15->denom;
    local_f8._0_8_ = (pSVar15->relations).ptr;
    local_f8._8_8_ = (pSVar15->numerator_relations).ptr;
    if (pSVar15 + 1 != pSVar13) {
      uStack_c0 = 0;
      uStack_bc = 0;
      pSVar15 = pSVar15 + 1;
      do {
        pSVar13 = pSVar15;
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  ((optional_ptr<duckdb::JoinRelationSet,_true> *)local_f8);
        uVar8 = local_f8._0_8_;
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->relations);
        local_f8._0_8_ =
             JoinRelationSetManager::Union
                       (&this->set_manager,(JoinRelationSet *)uVar8,(pSVar13->relations).ptr);
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  ((optional_ptr<duckdb::JoinRelationSet,_true> *)(local_f8 + 8));
        uVar8 = local_f8._8_8_;
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar13->numerator_relations);
        local_f8._8_8_ =
             JoinRelationSetManager::Union
                       (&this->set_manager,(JoinRelationSet *)uVar8,
                        (pSVar13->numerator_relations).ptr);
        pCVar16 = (CardinalityEstimator *)CONCAT44(local_c8._4_4_,(undefined4)local_c8);
        local_f8._16_8_ = pSVar13->denom * (double)local_f8._16_8_;
        pSVar15 = pSVar13 + 1;
      } while (pSVar13 + 1 !=
               local_138.
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               .
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      pSVar13 = pSVar13 + 1;
      pSVar15 = local_138.
                super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                .
                super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = uStack_c0;
      uVar20 = uStack_bc;
    }
  }
  pDVar9 = local_b8;
  dVar5 = 1.0;
  if ((pSVar15 != pSVar13) && ((pSVar15->denom != 0.0 || (dVar5 = 1.0, NAN(pSVar15->denom))))) {
    uStack_c0 = uVar19;
    uStack_bc = uVar20;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pSVar15->numerator_relations);
    pCVar16 = (CardinalityEstimator *)CONCAT44(local_c8._4_4_,(undefined4)local_c8);
    if (local_138.
        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_138.
        super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
        super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    local_d0 = (pSVar15->numerator_relations).ptr;
    dVar5 = (((double)CONCAT44(0x45300000,local_c8._4_4_) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(undefined4)local_c8) - 4503599627370496.0) + 1.0) *
            (local_138.
             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             .
             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ._M_impl.super__Vector_impl_data._M_start)->denom;
  }
  pDVar9->numerator_relations = local_d0;
  pDVar9->filter_strength = 1.0;
  pDVar9->denominator = dVar5;
  local_c8 = pCVar16;
  if ((CardinalityEstimator *)
      local_80.
      super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      .
      super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
      ._M_impl.super__Vector_impl_data._M_start != (CardinalityEstimator *)0x0) {
    operator_delete(local_80.
                    super_vector<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                    .
                    super__Vector_base<duckdb::FilterInfoWithTotalDomains,_std::allocator<duckdb::FilterInfoWithTotalDomains>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_138.
      super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>.
      super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
      ._M_impl.super__Vector_impl_data._M_start != (Subgraph2Denominator *)0x0) {
    operator_delete(local_138.
                    super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    .
                    super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return pDVar9;
}

Assistant:

DenomInfo CardinalityEstimator::GetDenominator(JoinRelationSet &set) {
	vector<Subgraph2Denominator> subgraphs;

	// Finding the denominator is tricky. You need to go through the tdoms in decreasing order
	// Then loop through all filters in the equivalence set of the tdom to see if both the
	// left and right relations are in the new set, if so you can use that filter.
	// You must also make sure that the filters all relations in the given set, so we use subgraphs
	// that should eventually merge into one connected graph that joins all the relations
	// TODO: Implement a method to cache subgraphs so you don't have to build them up every
	// time the cardinality of a new set is requested

	// relations_to_tdoms has already been sorted by largest to smallest total domain
	// then we look through the filters for the relations_to_tdoms,
	// and we start to choose the filters that join relations in the set.

	// edges are guaranteed to be in order of largest tdom to smallest tdom.
	unordered_set<idx_t> unused_edge_tdoms;
	auto edges = GetEdges(relations_to_tdoms, set);
	for (auto &edge : edges) {
		if (subgraphs.size() == 1 && subgraphs.at(0).relations->ToString() == set.ToString()) {
			// the first subgraph has connected all the desired relations, just skip the rest of the edges
			if (edge.has_tdom_hll) {
				unused_edge_tdoms.insert(edge.tdom_hll);
			}
			continue;
		}

		auto subgraph_connections = SubgraphsConnectedByEdge(edge, subgraphs);
		if (subgraph_connections.empty()) {
			// create a subgraph out of left and right, then merge right into left and add left to subgraphs.
			// this helps cover a case where there are no subgraphs yet, and the only join filter is a SEMI JOIN
			auto left_subgraph = Subgraph2Denominator();
			auto right_subgraph = Subgraph2Denominator();
			left_subgraph.relations = edge.filter_info->left_set;
			left_subgraph.numerator_relations = edge.filter_info->left_set;
			right_subgraph.relations = edge.filter_info->right_set;
			right_subgraph.numerator_relations = edge.filter_info->right_set;
			left_subgraph.numerator_relations = &UpdateNumeratorRelations(left_subgraph, right_subgraph, edge);
			left_subgraph.relations = edge.filter_info->set.get();
			left_subgraph.denom = CalculateUpdatedDenom(left_subgraph, right_subgraph, edge);
			subgraphs.push_back(left_subgraph);
		} else if (subgraph_connections.size() == 1) {
			auto left_subgraph = &subgraphs.at(subgraph_connections.at(0));
			auto right_subgraph = Subgraph2Denominator();
			right_subgraph.relations = edge.filter_info->right_set;
			right_subgraph.numerator_relations = edge.filter_info->right_set;
			if (JoinRelationSet::IsSubset(*left_subgraph->relations, *right_subgraph.relations)) {
				right_subgraph.relations = edge.filter_info->left_set;
				right_subgraph.numerator_relations = edge.filter_info->left_set;
			}

			if (JoinRelationSet::IsSubset(*left_subgraph->relations, *edge.filter_info->left_set) &&
			    JoinRelationSet::IsSubset(*left_subgraph->relations, *edge.filter_info->right_set)) {
				// here we have an edge that connects the same subgraph to the same subgraph. Just continue. no need to
				// update the denom
				continue;
			}
			left_subgraph->numerator_relations = &UpdateNumeratorRelations(*left_subgraph, right_subgraph, edge);
			left_subgraph->relations = &set_manager.Union(*left_subgraph->relations, *right_subgraph.relations);
			left_subgraph->denom = CalculateUpdatedDenom(*left_subgraph, right_subgraph, edge);
		} else if (subgraph_connections.size() == 2) {
			// The two subgraphs in the subgraph_connections can be merged by this edge.
			D_ASSERT(subgraph_connections.at(0) < subgraph_connections.at(1));
			auto subgraph_to_merge_into = &subgraphs.at(subgraph_connections.at(0));
			auto subgraph_to_delete = &subgraphs.at(subgraph_connections.at(1));
			subgraph_to_merge_into->relations =
			    &set_manager.Union(*subgraph_to_merge_into->relations, *subgraph_to_delete->relations);
			subgraph_to_merge_into->numerator_relations =
			    &UpdateNumeratorRelations(*subgraph_to_merge_into, *subgraph_to_delete, edge);
			subgraph_to_merge_into->denom = CalculateUpdatedDenom(*subgraph_to_merge_into, *subgraph_to_delete, edge);
			subgraph_to_delete->relations = nullptr;
			auto remove_start = std::remove_if(subgraphs.begin(), subgraphs.end(),
			                                   [](Subgraph2Denominator &s) { return !s.relations; });
			subgraphs.erase(remove_start, subgraphs.end());
		}
	}

	// Slight penalty to cardinality for unused edges
	auto denom_multiplier = 1.0 + static_cast<double>(unused_edge_tdoms.size());

	// It's possible cross-products were added and are not present in the filters in the relation_2_tdom
	// structures. When that's the case, merge all remaining subgraphs.
	if (subgraphs.size() > 1) {
		auto final_subgraph = subgraphs.at(0);
		for (auto merge_with = subgraphs.begin() + 1; merge_with != subgraphs.end(); merge_with++) {
			D_ASSERT(final_subgraph.relations && merge_with->relations);
			final_subgraph.relations = &set_manager.Union(*final_subgraph.relations, *merge_with->relations);
			D_ASSERT(final_subgraph.numerator_relations && merge_with->numerator_relations);
			final_subgraph.numerator_relations =
			    &set_manager.Union(*final_subgraph.numerator_relations, *merge_with->numerator_relations);
			final_subgraph.denom *= merge_with->denom;
		}
	}
	// can happen if a table has cardinality 0, a tdom is set to 0, or if a cross product is used.
	if (subgraphs.empty() || subgraphs.at(0).denom == 0) {
		// denominator is 1 and numerators are a cross product of cardinalities.
		return DenomInfo(set, 1, 1);
	}
	return DenomInfo(*subgraphs.at(0).numerator_relations, 1, subgraphs.at(0).denom * denom_multiplier);
}